

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_changesky(FCommandLine *argv,APlayerPawn *who,int key)

{
  FTextureID FVar1;
  int iVar2;
  FTextureID FVar3;
  char *name;
  
  if ((!netgame) && (iVar2 = FCommandLine::argc(argv), 1 < iVar2)) {
    name = FCommandLine::operator[](argv,1);
    FVar3 = sky1texture;
    FVar1 = level.skytexture1;
    if ((*name != '\0') &&
       (FVar3 = FTextureManager::GetTexture(&TexMan,name,1,6), FVar1 = FVar3, FVar3.texnum < 0)) {
      Printf("changesky: Texture \'%s\' not found\n",name);
      FVar3 = sky1texture;
      FVar1 = level.skytexture1;
    }
    level.skytexture1.texnum = FVar1.texnum;
    sky1texture.texnum = FVar3.texnum;
    R_InitSkyMap();
    return;
  }
  return;
}

Assistant:

CCMD(changesky)
{
	const char *sky1name;

	if (netgame || argv.argc()<2) return;

	sky1name = argv[1];
	if (sky1name[0] != 0)
	{
		FTextureID newsky = TexMan.GetTexture(sky1name, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable | FTextureManager::TEXMAN_ReturnFirst);
		if (newsky.Exists())
		{
			sky1texture = level.skytexture1 = newsky;
		}
		else
		{
			Printf("changesky: Texture '%s' not found\n", sky1name);
		}
	}
	R_InitSkyMap ();
}